

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

void target_release(void)

{
  _Bool _Var1;
  monster_conflict *mon_00;
  monster *mon;
  
  target_fixed = false;
  if ((old_target.midx != 0) &&
     (((mon_00 = cave_monster(cave,old_target.midx), mon_00 == (monster_conflict *)0x0 ||
       (mon_00->race == (monster_race *)0x0)) ||
      (_Var1 = monster_is_in_view((monster *)mon_00), !_Var1)))) {
    target.grid.y = 0;
    target.grid.x = 0;
  }
  return;
}

Assistant:

void target_release(void)
{
	target_fixed = false;

	/* If the old target is a now-dead monster, cancel it */
	if (old_target.midx != 0) {
		struct monster *mon = cave_monster(cave, old_target.midx);
		if (!mon || !mon->race || !monster_is_in_view(mon)) {
			target.grid.y = 0;
			target.grid.x = 0;
		}
	}
}